

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void Cmd_bumpgamma(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  
  uVar1 = -(uint)(3.0 < Gamma.Value + 0.1);
  FFloatCVar::operator=(&Gamma,(float)(~uVar1 & (uint)(Gamma.Value + 0.1) | uVar1 & 0x3f800000));
  Printf("Gamma correction level %g\n",(double)Gamma.Value);
  return;
}

Assistant:

CCMD (bumpgamma)
{
	// [RH] Gamma correction tables are now generated
	// on the fly for *any* gamma level.
	// Q: What are reasonable limits to use here?

	float newgamma = Gamma + 0.1f;

	if (newgamma > 3.0)
		newgamma = 1.0;

	Gamma = newgamma;
	Printf ("Gamma correction level %g\n", *Gamma);
}